

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

String * __thiscall
kj::HttpHeaders::serialize
          (String *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<const_char> word1,
          ArrayPtr<const_char> word2,ArrayPtr<const_char> word3,
          ArrayPtr<const_kj::StringPtr> connectionHeaders)

{
  ulong uVar1;
  void *__src;
  Header *pHVar2;
  Header *header;
  Header *pHVar3;
  char *target;
  ArrayPtr<const_kj::StringPtr> *pAVar4;
  size_t sVar5;
  char *pcVar6;
  Header *header_1;
  size_t sVar7;
  ArrayPtr<const_kj::StringPtr> *pAVar8;
  long lVar9;
  unsigned_long i;
  ulong uVar10;
  StringPtr *pSVar11;
  unsigned_long i_1;
  ulong uVar12;
  StringPtr newline;
  StringPtr space;
  Fault local_a8;
  StringPtr local_a0;
  ArrayPtr<const_kj::StringPtr> *local_90;
  size_t local_88;
  HttpHeaders *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  StringPtr local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_50.size_ = word2.size_;
  local_50.ptr = word2.ptr;
  sVar5 = word1.size_;
  local_40.ptr = word1.ptr;
  local_60.content.ptr = " ";
  local_60.content.size_ = 2;
  local_a0.content.ptr = "\r\n";
  local_a0.content.size_ = 3;
  uVar12 = (this->indexedHeaders).size_;
  local_40.size_ = sVar5;
  if (uVar12 < connectionHeaders.size_) {
    local_a8.exception = (Exception *)0x0;
    local_78 = 0;
    uStack_70 = 0;
    _::Debug::Fault::init
              (&local_a8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
              );
    _::Debug::Fault::fatal(&local_a8);
  }
  sVar7 = 2;
  if (sVar5 != 0) {
    sVar7 = word3.size_ + 6 + local_50.size_ + sVar5;
  }
  if (uVar12 != 0) {
    lVar9 = 8;
    uVar10 = 0;
    do {
      pSVar11 = (this->indexedHeaders).ptr;
      if (uVar10 < connectionHeaders.size_) {
        pSVar11 = connectionHeaders.ptr;
      }
      uVar1 = *(ulong *)((long)&(pSVar11->content).ptr + lVar9);
      if (1 < uVar1) {
        sVar7 = sVar7 + uVar1 +
                (this->table->namesById).builder.ptr[uVar10 & 0xffffffff].content.size_ + 2;
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar12 != uVar10);
  }
  for (pHVar3 = (this->unindexedHeaders).builder.ptr; pHVar3 != (this->unindexedHeaders).builder.pos
      ; pHVar3 = pHVar3 + 1) {
    sVar7 = sVar7 + (pHVar3->name).content.size_ + (pHVar3->value).content.size_ + 2;
  }
  heapString(__return_storage_ptr__,sVar7);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  if (sVar5 != 0) {
    target = _::
             fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                       (target,&local_40,&local_60,&local_50,&local_60,&word3,&local_a0);
  }
  sVar5 = (this->indexedHeaders).size_;
  if (sVar5 != 0) {
    lVar9 = 8;
    uVar12 = 0;
    pAVar8 = (ArrayPtr<const_kj::StringPtr> *)&this->indexedHeaders;
    local_90 = pAVar8;
    local_88 = sVar5;
    local_80 = this;
    do {
      pAVar4 = pAVar8;
      if (uVar12 < connectionHeaders.size_) {
        pAVar4 = &connectionHeaders;
      }
      uVar10 = *(ulong *)((long)&(pAVar4->ptr->content).ptr + lVar9);
      if (1 < uVar10) {
        __src = *(void **)((long)pAVar4->ptr + lVar9 + -8);
        pSVar11 = (this->table->namesById).builder.ptr;
        pcVar6 = pSVar11[uVar12 & 0xffffffff].content.ptr;
        sVar5 = pSVar11[uVar12 & 0xffffffff].content.size_;
        if (pcVar6 != pcVar6 + (sVar5 - 1)) {
          memcpy(target,pcVar6,sVar5 - 1);
          target = target + (sVar5 - 1);
        }
        this = local_80;
        target[0] = ':';
        target[1] = ' ';
        target = target + 2;
        if (__src != (void *)((long)__src + (uVar10 - 1))) {
          memcpy(target,__src,uVar10 - 1);
          target = target + (uVar10 - 1);
        }
        sVar7 = local_a0.content.size_;
        sVar5 = local_88;
        pAVar8 = local_90;
        if (local_a0.content.ptr != local_a0.content.ptr + (local_a0.content.size_ - 1)) {
          memcpy(target,local_a0.content.ptr,local_a0.content.size_ - 1);
          target = target + (sVar7 - 1);
          sVar5 = local_88;
          pAVar8 = local_90;
        }
      }
      uVar12 = uVar12 + 1;
      lVar9 = lVar9 + 0x10;
    } while (sVar5 != uVar12);
  }
  pHVar2 = (this->unindexedHeaders).builder.pos;
  for (pHVar3 = (this->unindexedHeaders).builder.ptr; sVar5 = local_a0.content.size_,
      pHVar3 != pHVar2; pHVar3 = pHVar3 + 1) {
    pcVar6 = (pHVar3->name).content.ptr;
    sVar5 = (pHVar3->name).content.size_;
    if (pcVar6 != pcVar6 + (sVar5 - 1)) {
      memcpy(target,pcVar6,sVar5 - 1);
      target = target + (sVar5 - 1);
    }
    target[0] = ':';
    target[1] = ' ';
    target = target + 2;
    pcVar6 = (pHVar3->value).content.ptr;
    sVar5 = (pHVar3->value).content.size_;
    if (pcVar6 != pcVar6 + (sVar5 - 1)) {
      memcpy(target,pcVar6,sVar5 - 1);
      target = target + (sVar5 - 1);
    }
    sVar5 = local_a0.content.size_;
    if (local_a0.content.ptr != local_a0.content.ptr + (local_a0.content.size_ - 1)) {
      memcpy(target,local_a0.content.ptr,local_a0.content.size_ - 1);
      target = target + (sVar5 - 1);
    }
  }
  if (local_a0.content.ptr != local_a0.content.ptr + (local_a0.content.size_ - 1)) {
    memcpy(target,local_a0.content.ptr,local_a0.content.size_ - 1);
    target = target + (sVar5 - 1);
  }
  sVar5 = (__return_storage_ptr__->content).size_;
  pcVar6 = (__return_storage_ptr__->content).ptr + (sVar5 - 1);
  if (sVar5 == 0) {
    pcVar6 = (char *)0x0;
  }
  if (target != pcVar6) {
    local_a8.exception = (Exception *)0x0;
    local_78 = 0;
    uStack_70 = 0;
    _::Debug::Fault::init
              (&local_a8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
              );
    _::Debug::Fault::fatal(&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String HttpHeaders::serialize(kj::ArrayPtr<const char> word1,
                                  kj::ArrayPtr<const char> word2,
                                  kj::ArrayPtr<const char> word3,
                                  kj::ArrayPtr<const kj::StringPtr> connectionHeaders) const {
  const kj::StringPtr space = " ";
  const kj::StringPtr newline = "\r\n";
  const kj::StringPtr colon = ": ";

  size_t size = 2;  // final \r\n
  if (word1 != nullptr) {
    size += word1.size() + word2.size() + word3.size() + 4;
  }
  KJ_ASSERT(connectionHeaders.size() <= indexedHeaders.size());
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      size += table->idToString(HttpHeaderId(table, i)).size() + value.size() + 4;
    }
  }
  for (auto& header: unindexedHeaders) {
    size += header.name.size() + header.value.size() + 4;
  }

  String result = heapString(size);
  char* ptr = result.begin();

  if (word1 != nullptr) {
    ptr = kj::_::fill(ptr, word1, space, word2, space, word3, newline);
  }
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      ptr = kj::_::fill(ptr, table->idToString(HttpHeaderId(table, i)), colon, value, newline);
    }
  }
  for (auto& header: unindexedHeaders) {
    ptr = kj::_::fill(ptr, header.name, colon, header.value, newline);
  }
  ptr = kj::_::fill(ptr, newline);

  KJ_ASSERT(ptr == result.end());
  return result;
}